

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLrelation.c
# Opt level: O3

void RDL_findTransitiveClosure(RDL_URFinfo *uInfo)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  RDL_stack *stack;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *pvVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint local_64;
  
  stack = RDL_stack_new();
  if (uInfo->nofWeights != 0) {
    uVar14 = 0;
    do {
      puVar6 = uInfo->nofProtos;
      uVar8 = (ulong)puVar6[uVar14];
      __ptr = calloc(1,uVar8);
      __ptr_00 = malloc(uVar8 * 8);
      __ptr_01 = malloc(uVar8 * 4);
      __ptr_02 = malloc(uVar8 * 4);
      if (uVar8 != 0) {
        uVar7 = 0;
        uVar13 = 0;
        uVar4 = 0;
        do {
          if (*(char *)((long)__ptr + uVar7) == '\0') {
            pvVar5 = malloc(uVar8 << 2);
            uVar8 = (ulong)uVar4;
            *(void **)((long)__ptr_00 + uVar8 * 8) = pvVar5;
            *(undefined4 *)((long)__ptr_01 + uVar8 * 4) = 0;
            *(int *)((long)__ptr_02 + (ulong)uVar13 * 4) = (int)uVar7;
            RDL_stack_push(stack,(void *)((long)__ptr_02 + (ulong)uVar13 * 4));
            uVar13 = uVar13 + 1;
            *(undefined1 *)((long)__ptr + uVar7) = 1;
            iVar3 = RDL_stack_empty(stack);
            if (iVar3 == 0) {
              local_64 = 0;
              do {
                puVar6 = (uint *)RDL_stack_top(stack);
                uVar1 = *puVar6;
                RDL_stack_pop(stack);
                *(uint *)((long)pvVar5 + (ulong)local_64 * 4) = uVar1;
                local_64 = local_64 + 1;
                *(uint *)((long)__ptr_01 + uVar8 * 4) = local_64;
                puVar6 = uInfo->nofProtos;
                if (puVar6[uVar14] != 0) {
                  uVar15 = 0;
                  do {
                    if ((*(char *)((long)__ptr + uVar15) == '\0') &&
                       (uInfo->URFrel[uVar14][uVar1][uVar15] != '\0')) {
                      *(undefined1 *)((long)__ptr + uVar15) = 1;
                      *(int *)((long)__ptr_02 + (ulong)uVar13 * 4) = (int)uVar15;
                      RDL_stack_push(stack,(void *)((long)__ptr_02 + (ulong)uVar13 * 4));
                      uVar13 = uVar13 + 1;
                      puVar6 = uInfo->nofProtos;
                    }
                    uVar15 = uVar15 + 1;
                  } while (uVar15 < puVar6[uVar14]);
                }
                iVar3 = RDL_stack_empty(stack);
              } while (iVar3 == 0);
            }
            uVar4 = uVar4 + 1;
            puVar6 = uInfo->nofProtos;
          }
          uVar7 = uVar7 + 1;
          uVar8 = (ulong)puVar6[uVar14];
        } while (uVar7 < uVar8);
        if (uVar4 != 0) {
          uVar8 = 0;
          do {
            uVar7 = (ulong)*(uint *)((long)__ptr_01 + uVar8 * 4);
            if (uVar7 != 0) {
              lVar9 = 0;
              uVar15 = uVar7;
              uVar10 = 0;
              do {
                uVar11 = uVar10 + 1;
                if (uVar11 < uVar7) {
                  lVar2 = *(long *)((long)__ptr_00 + uVar8 * 8);
                  lVar12 = 1;
                  do {
                    uVar13 = *(uint *)(lVar2 + uVar10 * 4);
                    uVar1 = *(uint *)(lVar2 + lVar9 + lVar12 * 4);
                    uInfo->URFrel[uVar14][uVar13][uVar1] = '\x01';
                    uInfo->URFrel[uVar14][uVar1][uVar13] = '\x01';
                    lVar12 = lVar12 + 1;
                  } while ((int)uVar15 != (int)lVar12);
                }
                lVar9 = lVar9 + 4;
                uVar15 = uVar15 - 1;
                uVar10 = uVar11;
              } while (uVar11 != uVar7);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar4);
          if (uVar4 != 0) {
            uVar8 = 0;
            do {
              free(*(void **)((long)__ptr_00 + uVar8 * 8));
              uVar8 = uVar8 + 1;
            } while (uVar4 != uVar8);
          }
        }
      }
      free(__ptr_00);
      free(__ptr_01);
      free(__ptr);
      free(__ptr_02);
      uVar14 = uVar14 + 1;
    } while (uVar14 < uInfo->nofWeights);
  }
  RDL_stack_delete(stack);
  return;
}

Assistant:

void RDL_findTransitiveClosure(RDL_URFinfo *uInfo)
{
  unsigned i,j,k,l;
  RDL_stack* dfs_stack;
  char* visited;
  unsigned cc_id;
  unsigned **cc;
  unsigned *cc_size;
  unsigned u, v;
  unsigned *elements;
  unsigned next_free_element;
  unsigned *curr_elem;

  dfs_stack = RDL_stack_new();

  for(i = 0; i < uInfo->nofWeights; ++i) {
    visited = malloc(uInfo->nofProtos[i] * sizeof(*visited));
    memset(visited, 0, uInfo->nofProtos[i] * sizeof(*visited));

    cc_id = 0;
    cc = malloc(uInfo->nofProtos[i] * sizeof(*cc));
    cc_size = malloc(uInfo->nofProtos[i] * sizeof(*cc_size));
    elements = malloc(uInfo->nofProtos[i] * sizeof(*elements));
    next_free_element = 0;

    /*
     * perform a DFS search on the URF relations
     * and collect the connected components
     */
    for(j = 0; j < uInfo->nofProtos[i]; ++j) {
      if (!visited[j]) {
        cc[cc_id] = malloc(uInfo->nofProtos[i] * sizeof(**cc));
        cc_size[cc_id] = 0;

        elements[next_free_element] = j;
        RDL_stack_push(dfs_stack, &(elements[next_free_element]));
        ++next_free_element;
        visited[j] = 1;
        while (!RDL_stack_empty(dfs_stack)) {
          curr_elem = RDL_stack_top(dfs_stack);
          k = *curr_elem;
          RDL_stack_pop(dfs_stack);

          /* save the connected components */
          cc[cc_id][cc_size[cc_id]] = k;
          ++cc_size[cc_id];

          for (l = 0; l < uInfo->nofProtos[i]; ++l) {
            if (!visited[l] && uInfo->URFrel[i][k][l]) {
              visited[l] = 1;
              elements[next_free_element] = l;
              RDL_stack_push(dfs_stack, &(elements[next_free_element]));
              ++next_free_element;
            }
          }
        }

        ++cc_id;
      }
    }

    /* every pair inside a CC is URF related */
    for(j = 0; j < cc_id; ++j) {
      for (k = 0; k < cc_size[j]; ++k) {
        for (l = k+1; l < cc_size[j]; ++l) {
          u = cc[j][k];
          v = cc[j][l];
          uInfo->URFrel[i][u][v] = 1;
          uInfo->URFrel[i][v][u] = 1;
        }
      }
    }

    for(j = 0; j < cc_id; ++j) {
      free(cc[j]);
    }
    free(cc);
    free(cc_size);
    free(visited);
    free(elements);
  }

  RDL_stack_delete(dfs_stack);
}